

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::Level::~Level(Level *this)

{
  pointer plVar1;
  pointer pFVar2;
  pointer ppFVar3;
  pointer ppFVar4;
  
  ppFVar4 = (this->faces).
            super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (this->faces).
            super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar4 != ppFVar3) {
    do {
      if (*ppFVar4 != (FaceData *)0x0) {
        (*((*ppFVar4)->super_PtexFaceData)._vptr_PtexFaceData[1])();
        ppFVar3 = (this->faces).
                  super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar4 = ppFVar4 + 1;
    } while (ppFVar4 != ppFVar3);
    ppFVar4 = (this->faces).
              super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppFVar4 != (pointer)0x0) {
    operator_delete(ppFVar4,(long)(this->faces).
                                  super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar4
                   );
  }
  plVar1 = (this->offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)(this->offsets).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar1);
  }
  pFVar2 = (this->fdh).
           super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->fdh).
                                 super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
    return;
  }
  return;
}

Assistant:

~Level() {
            for (std::vector<FaceData*>::iterator i = faces.begin(); i != faces.end(); ++i) {
                if (*i) delete *i;
            }
        }